

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O3

int64_t get_warp_error(WarpedMotionParams *wm,int use_hbd,int bd,uint8_t *ref,int ref_width,
                      int ref_height,int ref_stride,uint8_t *dst,int dst_stride,int p_col,int p_row,
                      int p_width,int p_height,int subsampling_x,int subsampling_y,
                      int64_t best_error,uint8_t *segment_map,int segment_map_stride)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *puVar11;
  uint16_t *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint8_t *puVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  undefined4 in_stack_00000034;
  undefined4 in_stack_0000003c;
  ConvolveParams conv_params;
  uint16_t tmp [1024];
  int64_t local_948;
  ulong local_938;
  ConvolveParams local_8b0;
  long local_880;
  long local_878;
  long local_870;
  long local_868;
  uint16_t local_860 [1048];
  
  local_948 = 0x7fffffffffffffff;
  iVar5 = av1_get_shear_params(wm);
  if (iVar5 != 0) {
    if (use_hbd == 0) {
      local_8b0.is_compound = 0;
      local_8b0.use_dist_wtd_comp_avg = 0;
      local_8b0.dst = (CONV_BUF_TYPE *)0x0;
      local_8b0.dst_stride = 0;
      local_8b0.round_0 = 3;
      local_8b0.round_1 = 0xb;
      local_8b0.plane = 0;
      local_8b0.do_average = 0;
      local_948 = 0;
      if (0 < p_row) {
        lVar13 = (long)dst_stride;
        local_938 = 0;
        local_948 = 0;
        puVar9 = dst;
        do {
          if (0 < p_col) {
            uVar15 = (uint)((long)ref_height - local_938);
            if (p_row < (int)uVar15) {
              uVar15 = p_row;
            }
            uVar22 = 0x20;
            if ((int)uVar15 < 0x20) {
              uVar22 = (ulong)uVar15;
            }
            uVar14 = 0;
            puVar18 = puVar9;
            uVar21 = ref_width;
            do {
              uVar7 = uVar21;
              if (p_col < (int)uVar21) {
                uVar7 = p_col;
              }
              if (0x1f < (int)uVar7) {
                uVar7 = 0x20;
              }
              if (*(char *)(CONCAT44(in_stack_0000003c,p_height) +
                           (long)((int)(uVar14 >> 5) + (int)(local_938 >> 5) * subsampling_x)) !=
                  '\0') {
                iVar5 = (int)((long)ref_width - uVar14);
                if (p_col < iVar5) {
                  iVar5 = p_col;
                }
                iVar6 = 0x20;
                if (iVar5 < 0x20) {
                  iVar6 = iVar5;
                }
                warp_plane(wm,ref,ref_width,ref_height,ref_stride,(uint8_t *)local_860,(int)uVar14,
                           (int)local_938,iVar6,(int)uVar22,0x20,0,0,&local_8b0);
                if (((int)uVar15 < 0x20) || (iVar5 < 0x20)) {
                  if ((long)((long)ref_height - local_938) < 1) {
                    if (CONCAT44(in_stack_00000034,p_width) < local_948) {
                      return 0x7fffffffffffffff;
                    }
                    goto LAB_003bccb5;
                  }
                  uVar8 = 0;
                  puVar12 = local_860;
                  iVar5 = 0;
                  puVar11 = puVar18;
                  do {
                    if (0 < (long)((long)ref_width - uVar14)) {
                      uVar19 = 0;
                      do {
                        uVar20 = (uint)puVar11[uVar19] - (uint)*(byte *)((long)puVar12 + uVar19);
                        uVar3 = -uVar20;
                        if (0 < (int)uVar20) {
                          uVar3 = uVar20;
                        }
                        iVar5 = iVar5 + (uVar3 & 0xff);
                        uVar19 = uVar19 + 1;
                      } while (uVar7 != uVar19);
                    }
                    uVar8 = uVar8 + 1;
                    puVar12 = puVar12 + 0x10;
                    puVar11 = puVar11 + lVar13;
                  } while (uVar8 != uVar22);
                  local_948 = local_948 + iVar5;
                  lVar16 = CONCAT44(in_stack_00000034,p_width);
                  bVar24 = SBORROW8(local_948,lVar16);
                  lVar2 = local_948 - lVar16;
                  bVar23 = local_948 == lVar16;
                }
                else {
                  uVar7 = (*aom_sad32x32)((uint8_t *)local_860,0x20,
                                          dst + uVar14 + local_938 * lVar13,dst_stride);
                  local_948 = local_948 + (ulong)uVar7;
                  lVar16 = CONCAT44(in_stack_00000034,p_width);
                  bVar24 = SBORROW8(local_948,lVar16);
                  lVar2 = local_948 - lVar16;
                  bVar23 = local_948 == lVar16;
                }
                if (!bVar23 && bVar24 == lVar2 < 0) {
                  return 0x7fffffffffffffff;
                }
              }
LAB_003bccb5:
              uVar14 = uVar14 + 0x20;
              uVar21 = uVar21 - 0x20;
              puVar18 = puVar18 + 0x20;
            } while ((long)uVar14 < (long)p_col);
          }
          local_938 = local_938 + 0x20;
          puVar9 = puVar9 + lVar13 * 0x20;
        } while (local_938 < (uint)p_row);
      }
    }
    else {
      local_8b0.round_0 = 3;
      local_8b0.round_1 = 0xb;
      if (10 < bd) {
        local_8b0.round_0 = bd + -7;
        local_8b0.round_1 = 0x15 - bd;
      }
      local_8b0.dst = (CONV_BUF_TYPE *)0x0;
      local_8b0.dst_stride = 0;
      local_8b0.plane = 0;
      local_8b0.do_average = 0;
      local_8b0.is_compound = 0;
      local_8b0.use_dist_wtd_comp_avg = 0;
      if (p_row < 1) {
        local_948 = 0;
      }
      else {
        lVar13 = (long)dst * 2;
        local_878 = (long)dst_stride;
        local_880 = (long)ref_height;
        local_868 = local_878 << 6;
        lVar2 = local_878 * 2;
        local_938 = 0;
        local_948 = 0;
        local_870 = lVar13;
        do {
          if (0 < p_col) {
            lVar16 = local_880 - local_938;
            uVar15 = (uint)lVar16;
            if (p_row < (int)uVar15) {
              uVar15 = p_row;
            }
            uVar22 = 0x20;
            if ((int)uVar15 < 0x20) {
              uVar22 = (ulong)uVar15;
            }
            lVar1 = local_870 + local_938 * local_878 * 2;
            uVar14 = 0;
            lVar17 = lVar13;
            uVar21 = ref_width;
            do {
              uVar7 = uVar21;
              if (p_col < (int)uVar21) {
                uVar7 = p_col;
              }
              if (0x1f < (int)uVar7) {
                uVar7 = 0x20;
              }
              if (*(char *)(CONCAT44(in_stack_0000003c,p_height) +
                           (long)((int)(uVar14 >> 5) + (int)(local_938 >> 5) * subsampling_x)) !=
                  '\0') {
                iVar5 = (int)((long)ref_width - uVar14);
                if (p_col < iVar5) {
                  iVar5 = p_col;
                }
                iVar6 = 0x20;
                if (iVar5 < 0x20) {
                  iVar6 = iVar5;
                }
                highbd_warp_plane(wm,(uint16_t *)((long)ref * 2),ref_width,ref_height,ref_stride,
                                  local_860,(int)uVar14,(int)local_938,iVar6,(int)uVar22,0x20,0,0,bd
                                  ,&local_8b0);
                if (((int)uVar15 < 0x20) || (iVar5 < 0x20)) {
                  if (lVar16 < 1) {
                    if (CONCAT44(in_stack_00000034,p_width) < local_948) {
                      return 0x7fffffffffffffff;
                    }
                    goto LAB_003bc9b9;
                  }
                  uVar8 = 0;
                  puVar12 = local_860;
                  iVar5 = 0;
                  lVar10 = lVar17;
                  do {
                    if (0 < (long)((long)ref_width - uVar14)) {
                      uVar19 = 0;
                      do {
                        uVar20 = (uint)*(ushort *)(lVar10 + uVar19 * 2) - (uint)puVar12[uVar19];
                        uVar3 = -uVar20;
                        if (0 < (int)uVar20) {
                          uVar3 = uVar20;
                        }
                        iVar5 = iVar5 + (uVar3 & 0xffff);
                        uVar19 = uVar19 + 1;
                      } while (uVar7 != uVar19);
                    }
                    uVar8 = uVar8 + 1;
                    puVar12 = puVar12 + 0x20;
                    lVar10 = lVar10 + lVar2;
                  } while (uVar8 != uVar22);
                  local_948 = local_948 + iVar5;
                  lVar4 = CONCAT44(in_stack_00000034,p_width);
                  bVar24 = SBORROW8(local_948,lVar4);
                  lVar10 = local_948 - lVar4;
                  bVar23 = local_948 == lVar4;
                }
                else {
                  uVar7 = (*aom_highbd_sad32x32)
                                    ((uint8_t *)((ulong)local_860 >> 1),0x20,
                                     (uint8_t *)(lVar1 + uVar14 * 2 >> 1),dst_stride);
                  local_948 = local_948 + (ulong)uVar7;
                  lVar4 = CONCAT44(in_stack_00000034,p_width);
                  bVar24 = SBORROW8(local_948,lVar4);
                  lVar10 = local_948 - lVar4;
                  bVar23 = local_948 == lVar4;
                }
                if (!bVar23 && bVar24 == lVar10 < 0) {
                  return 0x7fffffffffffffff;
                }
              }
LAB_003bc9b9:
              uVar14 = uVar14 + 0x20;
              uVar21 = uVar21 - 0x20;
              lVar17 = lVar17 + 0x40;
            } while ((long)uVar14 < (long)p_col);
          }
          local_938 = local_938 + 0x20;
          lVar13 = lVar13 + local_868;
        } while (local_938 < (uint)p_row);
      }
    }
  }
  return local_948;
}

Assistant:

static int64_t get_warp_error(WarpedMotionParams *wm, int use_hbd, int bd,
                              const uint8_t *ref, int ref_width, int ref_height,
                              int ref_stride, uint8_t *dst, int dst_stride,
                              int p_col, int p_row, int p_width, int p_height,
                              int subsampling_x, int subsampling_y,
                              int64_t best_error, uint8_t *segment_map,
                              int segment_map_stride) {
  if (!av1_get_shear_params(wm)) return INT64_MAX;
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd)
    return highbd_warp_error(wm, CONVERT_TO_SHORTPTR(ref), ref_width,
                             ref_height, ref_stride, CONVERT_TO_SHORTPTR(dst),
                             dst_stride, p_col, p_row, p_width, p_height,
                             subsampling_x, subsampling_y, bd, best_error,
                             segment_map, segment_map_stride);
#endif
  (void)use_hbd;
  (void)bd;
  return warp_error(wm, ref, ref_width, ref_height, ref_stride, dst, dst_stride,
                    p_col, p_row, p_width, p_height, subsampling_x,
                    subsampling_y, best_error, segment_map, segment_map_stride);
}